

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O2

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  pointer pbVar4;
  char *pcVar5;
  char *__s;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  pointer __lhs;
  bool excludeFromAll;
  string srcPath;
  string binPath;
  string local_208;
  string binArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string error;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 == pbVar4) {
    std::__cxx11::string::string
              ((string *)&error,"called with incorrect number of arguments",(allocator *)&binArg);
    cmCommand::SetError(&this->super_cmCommand,&error);
    std::__cxx11::string::~string((string *)&error);
    return false;
  }
  binArg._M_dataplus._M_p = (pointer)&binArg.field_2;
  binArg._M_string_length = 0;
  binArg.field_2._M_local_buf[0] = '\0';
  excludeFromAll = false;
  __lhs = pbVar1;
  while (__lhs = __lhs + 1, __lhs != pbVar4) {
    bVar2 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
    bVar3 = true;
    if (!bVar2) {
      if (binArg._M_string_length != 0) {
        std::__cxx11::string::string
                  ((string *)&error,"called with incorrect number of arguments",
                   (allocator *)&srcPath);
        cmCommand::SetError(&this->super_cmCommand,&error);
        std::__cxx11::string::~string((string *)&error);
        bVar3 = false;
        goto LAB_003544ac;
      }
      std::__cxx11::string::_M_assign((string *)&binArg);
      bVar3 = excludeFromAll;
    }
    excludeFromAll = bVar3;
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  srcPath._M_dataplus._M_p = (pointer)&srcPath.field_2;
  srcPath._M_string_length = 0;
  srcPath.field_2._M_local_buf[0] = '\0';
  bVar3 = cmsys::SystemTools::FileIsFullPath((pbVar1->_M_dataplus)._M_p);
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&srcPath);
  }
  else {
    cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::assign((char *)&srcPath);
    std::__cxx11::string::append((char *)&srcPath);
    std::__cxx11::string::append((string *)&srcPath);
  }
  bVar3 = cmsys::SystemTools::FileIsDirectory(&srcPath);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&error,"given source \"",(allocator *)&binPath);
    std::__cxx11::string::append((string *)&error);
    std::__cxx11::string::append((char *)&error);
    cmCommand::SetError(&this->super_cmCommand,&error);
    std::__cxx11::string::~string((string *)&error);
    bVar3 = false;
    goto LAB_003544a2;
  }
  cmsys::SystemTools::CollapseFullPath(&error,&srcPath);
  std::__cxx11::string::operator=((string *)&srcPath,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  binPath._M_dataplus._M_p = (pointer)&binPath.field_2;
  binPath._M_string_length = 0;
  binPath.field_2._M_local_buf[0] = '\0';
  if (binArg._M_string_length == 0) {
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&error,pcVar5,(allocator *)&local_208);
    bVar3 = cmsys::SystemTools::IsSubDirectory(&srcPath,&error);
    std::__cxx11::string::~string((string *)&error);
    if (bVar3) {
      pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      __s = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      strlen(pcVar5);
      sVar6 = strlen(__s);
      if (sVar6 == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = sVar6 - (__s[sVar6 - 1] == '/');
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,__s,__s + lVar8);
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&srcPath);
      std::operator+(&error,&local_208,&local_1c8);
      std::__cxx11::string::operator=((string *)&binPath,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_208);
      goto LAB_00354443;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar7 = std::operator<<((ostream *)&error,
                             "not given a binary directory but the given source directory ");
    poVar7 = std::operator<<(poVar7,"\"");
    poVar7 = std::operator<<(poVar7,(string *)&srcPath);
    poVar7 = std::operator<<(poVar7,"\" is not a subdirectory of \"");
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    poVar7 = std::operator<<(poVar7,pcVar5);
    poVar7 = std::operator<<(poVar7,"\".  ");
    poVar7 = std::operator<<(poVar7,"When specifying an out-of-tree source a binary directory ");
    std::operator<<(poVar7,"must be explicitly specified.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
    bVar3 = false;
  }
  else {
    bVar3 = cmsys::SystemTools::FileIsFullPath(binArg._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&binPath);
    }
    else {
      cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)&binPath);
      std::__cxx11::string::append((char *)&binPath);
      std::__cxx11::string::append((string *)&binPath);
    }
LAB_00354443:
    cmsys::SystemTools::CollapseFullPath(&error,&binPath);
    std::__cxx11::string::operator=((string *)&binPath,(string *)&error);
    std::__cxx11::string::~string((string *)&error);
    bVar3 = true;
    cmMakefile::AddSubDirectory
              ((this->super_cmCommand).Makefile,&srcPath,&binPath,excludeFromAll,true);
  }
  std::__cxx11::string::~string((string *)&binPath);
LAB_003544a2:
  std::__cxx11::string::~string((string *)&srcPath);
LAB_003544ac:
  std::__cxx11::string::~string((string *)&binArg);
  return bVar3;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args[0];
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  for (; i != args.end(); ++i) {
    if (*i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = *i;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg.c_str())) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const char* src = this->Makefile->GetCurrentSourceDirectory();
    const char* bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = strlen(src);
    size_t binLen = strlen(bin);
    if (srcLen > 0 && src[srcLen - 1] == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin[binLen - 1] == '/') {
      --binLen;
    }
    binPath = std::string(bin, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg.c_str())) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}